

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexBindingOffsetCase::test
          (VertexBindingOffsetCase *this,ResultCollector *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestLog *pTVar3;
  int iVar4;
  GLenum GVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar7;
  undefined4 extraout_var_01;
  long *plVar8;
  undefined4 extraout_var_02;
  size_type *psVar9;
  int binding;
  uint uVar10;
  ulong uVar11;
  undefined8 uVar12;
  ScopedLogSection section;
  ScopedLogSection section_1;
  GLint reportedMaxBindings;
  CallLogWrapper gl;
  VertexArray otherVao;
  Buffer buffer;
  VertexArray vao;
  ScopedLogSection local_160;
  long local_158;
  TestLog local_150;
  long lStack_148;
  string local_140;
  string local_120;
  ulong *local_100;
  long local_f8;
  ulong local_f0 [2];
  string local_e0;
  ResultCollector *local_c0;
  ScopedLogSection local_b8;
  uint local_b0;
  uint local_ac;
  CallLogWrapper local_a8;
  code *local_90;
  GLenum local_88;
  ObjectWrapper local_80;
  VertexBindingOffsetCase *local_68;
  ObjectWrapper local_60;
  ObjectWrapper local_48;
  
  local_c0 = result;
  iVar4 = (*((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_a8,(Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log);
  iVar4 = (*((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  pOVar7 = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper(&local_48,(Functions *)CONCAT44(extraout_var_00,iVar4),pOVar7);
  iVar4 = (*((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  pOVar7 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_60,(Functions *)CONCAT44(extraout_var_01,iVar4),pOVar7);
  local_ac = 0xffffffff;
  local_a8.m_enableLog = true;
  glu::CallLogWrapper::glBindVertexArray(&local_a8,local_48.m_object);
  glu::CallLogWrapper::glGetIntegerv(&local_a8,0x82da,(GLint *)&local_ac);
  GVar5 = glu::CallLogWrapper::glGetError(&local_a8);
  if (GVar5 != 0) {
    local_100 = local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"Got Error ","");
    local_80.m_gl = (Functions *)glu::getErrorName;
    local_80.m_traits._0_4_ = GVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_e0,&local_80);
    uVar11 = 0xf;
    if (local_100 != local_f0) {
      uVar11 = local_f0[0];
    }
    if (uVar11 < local_e0._M_string_length + local_f8) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        uVar12 = local_e0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_e0._M_string_length + local_f8) goto LAB_0153b6c4;
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_e0,0,(char *)0x0,(ulong)local_100);
    }
    else {
LAB_0153b6c4:
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_100,(ulong)local_e0._M_dataplus._M_p);
    }
    local_160.m_log = &local_150;
    pTVar3 = (TestLog *)(plVar8 + 2);
    if ((TestLog *)*plVar8 == pTVar3) {
      local_150.m_log = pTVar3->m_log;
      lStack_148 = plVar8[3];
    }
    else {
      local_150.m_log = pTVar3->m_log;
      local_160.m_log = (TestLog *)*plVar8;
    }
    local_158 = plVar8[1];
    *plVar8 = (long)pTVar3;
    plVar8[1] = 0;
    *(undefined1 *)&pTVar3->m_log = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_160);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_140.field_2._M_allocated_capacity = *psVar9;
      local_140.field_2._8_8_ = plVar8[3];
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar9;
      local_140._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_140._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_120.field_2._M_allocated_capacity = *psVar9;
      local_120.field_2._8_8_ = plVar8[3];
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    }
    else {
      local_120.field_2._M_allocated_capacity = *psVar9;
      local_120._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_120._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::ResultCollector::fail(local_c0,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if (local_160.m_log != &local_150) {
      operator_delete(local_160.m_log,(ulong)((long)&(local_150.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != local_f0) {
      operator_delete(local_100,local_f0[0] + 1);
    }
  }
  local_b0 = 0x10;
  if (0x10 < (int)local_ac) {
    local_b0 = local_ac;
  }
  pTVar3 = ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  paVar1 = &local_120.field_2;
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"initial","");
  paVar2 = &local_140.field_2;
  local_140._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"Initial values","");
  tcu::ScopedLogSection::ScopedLogSection(&local_160,pTVar3,&local_120,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  uVar10 = 0;
  do {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (local_c0,&local_a8,0x82d7,uVar10,0,(this->super_IndexedCase).m_verifier);
    uVar10 = uVar10 + 1;
  } while (local_b0 != uVar10);
  tcu::TestLog::endSection(local_160.m_log);
  pTVar3 = ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"vao","");
  local_140._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"VAO state","");
  tcu::ScopedLogSection::ScopedLogSection(&local_b8,pTVar3,&local_120,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  iVar4 = (*((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  pOVar7 = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper(&local_80,(Functions *)CONCAT44(extraout_var_02,iVar4),pOVar7);
  glu::CallLogWrapper::glBindVertexBuffer(&local_a8,1,local_60.m_object,4,0x20);
  GVar5 = glu::CallLogWrapper::glGetError(&local_a8);
  if (GVar5 != 0) {
    local_100 = local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"Got Error ","");
    local_90 = glu::getErrorName;
    local_88 = GVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_e0,&local_90);
    uVar11 = 0xf;
    if (local_100 != local_f0) {
      uVar11 = local_f0[0];
    }
    if (uVar11 < local_e0._M_string_length + local_f8) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        uVar12 = local_e0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_e0._M_string_length + local_f8) goto LAB_0153bad2;
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_e0,0,(char *)0x0,(ulong)local_100);
    }
    else {
LAB_0153bad2:
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_100,(ulong)local_e0._M_dataplus._M_p);
    }
    local_160.m_log = &local_150;
    pTVar3 = (TestLog *)(plVar8 + 2);
    if ((TestLog *)*plVar8 == pTVar3) {
      local_150.m_log = pTVar3->m_log;
      lStack_148 = plVar8[3];
    }
    else {
      local_150.m_log = pTVar3->m_log;
      local_160.m_log = (TestLog *)*plVar8;
    }
    local_158 = plVar8[1];
    *plVar8 = (long)pTVar3;
    plVar8[1] = 0;
    *(undefined1 *)&pTVar3->m_log = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_160);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_140.field_2._M_allocated_capacity = *psVar9;
      local_140.field_2._8_8_ = plVar8[3];
      local_140._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar9;
      local_140._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_140._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_120.field_2._M_allocated_capacity = *psVar9;
      local_120.field_2._8_8_ = plVar8[3];
      local_120._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_120.field_2._M_allocated_capacity = *psVar9;
      local_120._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_120._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::ResultCollector::fail(local_c0,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if (local_160.m_log != &local_150) {
      operator_delete(local_160.m_log,(ulong)((long)&(local_150.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != local_f0) {
      operator_delete(local_100,local_f0[0] + 1);
    }
  }
  glu::CallLogWrapper::glBindVertexArray(&local_a8,local_80.m_object);
  GVar5 = glu::CallLogWrapper::glGetError(&local_a8);
  if (GVar5 != 0) {
    local_100 = local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"Got Error ","");
    local_90 = glu::getErrorName;
    local_88 = GVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_e0,&local_90);
    uVar11 = 0xf;
    if (local_100 != local_f0) {
      uVar11 = local_f0[0];
    }
    if (uVar11 < local_e0._M_string_length + local_f8) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        uVar12 = local_e0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_e0._M_string_length + local_f8) goto LAB_0153bd2d;
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_e0,0,(char *)0x0,(ulong)local_100);
    }
    else {
LAB_0153bd2d:
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_100,(ulong)local_e0._M_dataplus._M_p);
    }
    local_160.m_log = &local_150;
    pTVar3 = (TestLog *)(plVar8 + 2);
    if ((TestLog *)*plVar8 == pTVar3) {
      local_150.m_log = pTVar3->m_log;
      lStack_148 = plVar8[3];
    }
    else {
      local_150.m_log = pTVar3->m_log;
      local_160.m_log = (TestLog *)*plVar8;
    }
    local_158 = plVar8[1];
    *plVar8 = (long)pTVar3;
    plVar8[1] = 0;
    *(undefined1 *)&pTVar3->m_log = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_160);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_140.field_2._M_allocated_capacity = *psVar9;
      local_140.field_2._8_8_ = plVar8[3];
      local_140._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar9;
      local_140._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_140._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_120.field_2._M_allocated_capacity = *psVar9;
      local_120.field_2._8_8_ = plVar8[3];
      local_120._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_120.field_2._M_allocated_capacity = *psVar9;
      local_120._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_120._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::ResultCollector::fail(local_c0,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if (local_160.m_log != &local_150) {
      operator_delete(local_160.m_log,(ulong)((long)&(local_150.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != local_f0) {
      operator_delete(local_100,local_f0[0] + 1);
    }
  }
  glu::CallLogWrapper::glBindVertexBuffer(&local_a8,1,local_60.m_object,0xd,0x20);
  GVar5 = glu::CallLogWrapper::glGetError(&local_a8);
  if (GVar5 != 0) {
    local_100 = local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"Got Error ","");
    local_90 = glu::getErrorName;
    local_88 = GVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_e0,&local_90);
    uVar11 = 0xf;
    if (local_100 != local_f0) {
      uVar11 = local_f0[0];
    }
    if (uVar11 < local_e0._M_string_length + local_f8) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        uVar12 = local_e0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_e0._M_string_length + local_f8) goto LAB_0153bf98;
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_e0,0,(char *)0x0,(ulong)local_100);
    }
    else {
LAB_0153bf98:
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_100,(ulong)local_e0._M_dataplus._M_p);
    }
    local_160.m_log = &local_150;
    pTVar3 = (TestLog *)(plVar8 + 2);
    if ((TestLog *)*plVar8 == pTVar3) {
      local_150.m_log = pTVar3->m_log;
      lStack_148 = plVar8[3];
    }
    else {
      local_150.m_log = pTVar3->m_log;
      local_160.m_log = (TestLog *)*plVar8;
    }
    local_158 = plVar8[1];
    *plVar8 = (long)pTVar3;
    plVar8[1] = 0;
    *(undefined1 *)&pTVar3->m_log = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_160);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_140.field_2._M_allocated_capacity = *psVar9;
      local_140.field_2._8_8_ = plVar8[3];
      local_140._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar9;
      local_140._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_140._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_120.field_2._M_allocated_capacity = *psVar9;
      local_120.field_2._8_8_ = plVar8[3];
      local_120._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_120.field_2._M_allocated_capacity = *psVar9;
      local_120._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_120._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::ResultCollector::fail(local_c0,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if (local_160.m_log != &local_150) {
      operator_delete(local_160.m_log,(ulong)((long)&(local_150.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != local_f0) {
      operator_delete(local_100,local_f0[0] + 1);
    }
  }
  glu::CallLogWrapper::glBindVertexArray(&local_a8,local_48.m_object);
  GVar5 = glu::CallLogWrapper::glGetError(&local_a8);
  if (GVar5 == 0) goto LAB_0153c38f;
  local_100 = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"Got Error ","");
  local_90 = glu::getErrorName;
  local_88 = GVar5;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_e0,&local_90);
  uVar11 = 0xf;
  if (local_100 != local_f0) {
    uVar11 = local_f0[0];
  }
  if (uVar11 < local_e0._M_string_length + local_f8) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      uVar12 = local_e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_e0._M_string_length + local_f8) goto LAB_0153c1f3;
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_100);
  }
  else {
LAB_0153c1f3:
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_100,(ulong)local_e0._M_dataplus._M_p);
  }
  local_160.m_log = &local_150;
  pTVar3 = (TestLog *)(plVar8 + 2);
  if ((TestLog *)*plVar8 == pTVar3) {
    local_150.m_log = pTVar3->m_log;
    lStack_148 = plVar8[3];
  }
  else {
    local_150.m_log = pTVar3->m_log;
    local_160.m_log = (TestLog *)*plVar8;
  }
  local_158 = plVar8[1];
  *plVar8 = (long)pTVar3;
  plVar8[1] = 0;
  *(undefined1 *)&pTVar3->m_log = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_160);
  psVar9 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_140.field_2._M_allocated_capacity = *psVar9;
    local_140.field_2._8_8_ = plVar8[3];
    local_140._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_140.field_2._M_allocated_capacity = *psVar9;
    local_140._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_140._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar9 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_120.field_2._M_allocated_capacity = *psVar9;
    local_120.field_2._8_8_ = plVar8[3];
    local_120._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_120.field_2._M_allocated_capacity = *psVar9;
    local_120._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_120._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  tcu::ResultCollector::fail(local_c0,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (local_160.m_log != &local_150) {
    operator_delete(local_160.m_log,(ulong)((long)&(local_150.m_log)->flags + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100,local_f0[0] + 1);
  }
LAB_0153c38f:
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (local_c0,&local_a8,0x82d7,1,4,(this->super_IndexedCase).m_verifier);
  glu::ObjectWrapper::~ObjectWrapper(&local_80);
  tcu::TestLog::endSection(local_b8.m_log);
  pTVar3 = ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"random","");
  local_140._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"Random values","");
  tcu::ScopedLogSection::ScopedLogSection(&local_b8,pTVar3,&local_120,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  local_68 = this;
  deRandom_init((deRandom *)&local_80,0xabc);
  iVar4 = 10;
  do {
    dVar6 = deRandom_getUint32((deRandom *)&local_80);
    uVar10 = dVar6 % local_b0;
    dVar6 = deRandom_getUint32((deRandom *)&local_80);
    glu::CallLogWrapper::glBindVertexBuffer
              (&local_a8,uVar10,local_60.m_object,(ulong)(dVar6 % 0xfa1),0x20);
    GVar5 = glu::CallLogWrapper::glGetError(&local_a8);
    if (GVar5 != 0) {
      local_100 = local_f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"Got Error ","");
      local_90 = glu::getErrorName;
      local_88 = GVar5;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_e0,&local_90);
      uVar11 = 0xf;
      if (local_100 != local_f0) {
        uVar11 = local_f0[0];
      }
      if (uVar11 < local_e0._M_string_length + local_f8) {
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          uVar12 = local_e0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_e0._M_string_length + local_f8) goto LAB_0153c596;
        plVar8 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_e0,0,(char *)0x0,(ulong)local_100);
      }
      else {
LAB_0153c596:
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_100,(ulong)local_e0._M_dataplus._M_p);
      }
      local_160.m_log = &local_150;
      pTVar3 = (TestLog *)(plVar8 + 2);
      if ((TestLog *)*plVar8 == pTVar3) {
        local_150.m_log = pTVar3->m_log;
        lStack_148 = plVar8[3];
      }
      else {
        local_150.m_log = pTVar3->m_log;
        local_160.m_log = (TestLog *)*plVar8;
      }
      local_158 = plVar8[1];
      *plVar8 = (long)pTVar3;
      plVar8[1] = 0;
      *(undefined1 *)&pTVar3->m_log = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_160);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_140.field_2._M_allocated_capacity = *psVar9;
        local_140.field_2._8_8_ = plVar8[3];
      }
      else {
        local_140.field_2._M_allocated_capacity = *psVar9;
        local_140._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_140._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_120.field_2._M_allocated_capacity = *psVar9;
        local_120.field_2._8_8_ = plVar8[3];
      }
      else {
        local_120.field_2._M_allocated_capacity = *psVar9;
        local_120._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_120._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::ResultCollector::fail(local_c0,&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if (local_160.m_log != &local_150) {
        operator_delete(local_160.m_log,(ulong)((long)&(local_150.m_log)->flags + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if (local_100 != local_f0) {
        operator_delete(local_100,local_f0[0] + 1);
      }
    }
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (local_c0,&local_a8,0x82d7,uVar10,dVar6 % 0xfa1,
               (local_68->super_IndexedCase).m_verifier);
    iVar4 = iVar4 + -1;
    if (iVar4 == 0) {
      tcu::TestLog::endSection(local_b8.m_log);
      glu::ObjectWrapper::~ObjectWrapper(&local_60);
      glu::ObjectWrapper::~ObjectWrapper(&local_48);
      glu::CallLogWrapper::~CallLogWrapper(&local_a8);
      return;
    }
  } while( true );
}

Assistant:

void VertexBindingOffsetCase::test (tcu::ResultCollector& result)
{
	glu::CallLogWrapper gl					(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::VertexArray	vao					(m_context.getRenderContext());
	glu::Buffer			buffer				(m_context.getRenderContext());
	glw::GLint			reportedMaxBindings	= -1;
	glw::GLint			maxBindings;

	gl.enableLogging(true);

	gl.glBindVertexArray(*vao);
	gl.glGetIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &reportedMaxBindings);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	maxBindings = de::max(16, reportedMaxBindings);

	// initial
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "initial", "Initial values");

		for (int binding = 0; binding < maxBindings; ++binding)
			verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_OFFSET, binding, 0, m_verifier);
	}

	// is part of vao
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "vao", "VAO state");
		glu::VertexArray			otherVao		(m_context.getRenderContext());

		// set to value A in vao1
		gl.glBindVertexBuffer(1, *buffer, 4, 32);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexBuffer");

		// set to value B in vao2
		gl.glBindVertexArray(*otherVao);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexArray");

		gl.glBindVertexBuffer(1, *buffer, 13, 32);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexBuffer");

		// check value is still ok in original vao
		gl.glBindVertexArray(*vao);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexArray");

		verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_OFFSET, 1, 4, m_verifier);
	}

	// random values
	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "random", "Random values");
		de::Random					rnd				(0xabc);
		const int					numRandomTests	= 10;

		for (int randomTestNdx = 0; randomTestNdx < numRandomTests; ++randomTestNdx)
		{
			const int	binding			= rnd.getInt(0, maxBindings-1);
			const int	offset			= rnd.getInt(0, 4000);

			gl.glBindVertexBuffer(binding, *buffer, offset, 32);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexBuffer");

			verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_OFFSET, binding, offset, m_verifier);
		}
	}
}